

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void __thiscall
pybind11::detail::generic_type::def_property_static_impl
          (generic_type *this,char *name,handle fget,handle fset,function_record *rec_func)

{
  internals *piVar1;
  char *c;
  char cVar2;
  accessor<pybind11::detail::accessor_policies::str_attr> local_98;
  handle local_78;
  handle property;
  handle local_68;
  char *local_60;
  object local_58;
  object local_50;
  object local_48;
  object local_40;
  object local_38;
  
  local_60 = name;
  if (rec_func == (function_record *)0x0) {
    local_78.m_ptr = (PyObject *)&PyProperty_Type;
    cVar2 = '\0';
  }
  else {
    cVar2 = options::global_state()::instance;
    if ((rec_func->field_0x59 & 0x40) == 0) {
      if (rec_func->doc == (char *)0x0) {
        cVar2 = '\0';
      }
    }
    else {
      if (rec_func->doc == (char *)0x0) {
        cVar2 = '\0';
      }
      if ((rec_func->scope).m_ptr != (PyObject *)0x0) {
        local_78.m_ptr = (PyObject *)&PyProperty_Type;
        goto LAB_0011446d;
      }
    }
    piVar1 = get_internals();
    local_78.m_ptr = (PyObject *)piVar1->static_property_type;
  }
LAB_0011446d:
  property.m_ptr = fget.m_ptr;
  if (fget.m_ptr == (PyObject *)0x0) {
    local_58.super_handle.m_ptr = (handle)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    property.m_ptr = (PyObject *)&_Py_NoneStruct;
  }
  local_68.m_ptr = fset.m_ptr;
  if (fset.m_ptr == (PyObject *)0x0) {
    local_50.super_handle.m_ptr = (handle)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    local_68.m_ptr = (PyObject *)&_Py_NoneStruct;
  }
  local_40.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  if (cVar2 == '\0') {
    c = "";
  }
  else {
    c = rec_func->doc;
  }
  str::str((str *)&local_38,c);
  object_api<pybind11::handle>::operator()
            ((object_api<pybind11::handle> *)&local_48,&local_78,&property,(none *)&local_68,
             (str *)&local_40);
  local_98.obj.m_ptr = (this->super_object).super_handle.m_ptr;
  local_98.key = local_60;
  local_98.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
  accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_98,&local_48);
  object::~object(&local_98.cache);
  object::~object(&local_48);
  object::~object(&local_38);
  object::~object(&local_40);
  if (fset.m_ptr == (PyObject *)0x0) {
    object::~object(&local_50);
  }
  if (fget.m_ptr == (PyObject *)0x0) {
    object::~object(&local_58);
  }
  return;
}

Assistant:

void def_property_static_impl(const char *name,
                                  handle fget, handle fset,
                                  detail::function_record *rec_func) {
        const auto is_static = rec_func && !(rec_func->is_method && rec_func->scope);
        const auto has_doc = rec_func && rec_func->doc && pybind11::options::show_user_defined_docstrings();
        auto property = handle((PyObject *) (is_static ? get_internals().static_property_type
                                                       : &PyProperty_Type));
        attr(name) = property(fget.ptr() ? fget : none(),
                              fset.ptr() ? fset : none(),
                              /*deleter*/none(),
                              pybind11::str(has_doc ? rec_func->doc : ""));
    }